

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

string * __thiscall
booster::locale::impl_std::utf8_numpunct::do_grouping_abi_cxx11_(utf8_numpunct *this)

{
  byte bVar1;
  string *in_RDI;
  uchar bs;
  
  bVar1 = std::__cxx11::numpunct<char>::do_thousands_sep();
  if ((bVar1 < 0x80) || (bVar1 == 0xa0)) {
    std::__cxx11::numpunct<char>::do_grouping();
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

virtual std::string do_grouping() const
    {
        unsigned char bs = base_type::do_thousands_sep();
        if(bs > 127 && bs != 0xA0)
            return std::string();
        return base_type::do_grouping();
    }